

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall gnilk::LogConsoleSink::~LogConsoleSink(LogConsoleSink *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LogBaseSink).super_ILogOutputSink._vptr_ILogOutputSink =
       (_func_int **)&PTR_Initialize_0011ca08;
  pcVar2 = (this->super_LogBaseSink).name._M_dataplus._M_p;
  paVar1 = &(this->super_LogBaseSink).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~LogConsoleSink() = default;